

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall wasm::TranslateToFuzzReader::setupMemory(TranslateToFuzzReader *this)

{
  Random *pRVar1;
  Module *pMVar2;
  TranslateToFuzzReader *pTVar3;
  DataSegment *pDVar4;
  uint32_t uVar5;
  char *pcVar6;
  Const *pCVar7;
  bool isPassive;
  bool isPassive_00;
  ulong uVar8;
  size_t i;
  pointer pcVar9;
  ulong uVar10;
  Name name;
  Name memory_00;
  Name memory_01;
  string_view sVar11;
  undefined1 auVar12 [16];
  Name NVar13;
  Literal local_a0;
  Literal local_88;
  size_t local_70;
  ulong local_68;
  Builder *local_60;
  long local_58;
  long *local_50;
  TranslateToFuzzReader *local_48;
  char local_39;
  DataSegment *local_38;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> memory;
  
  if (*(long *)(this->wasm + 0x78) == *(long *)(this->wasm + 0x80)) {
    sVar11 = (string_view)wasm::IString::interned(1,"0",0);
    local_38 = (DataSegment *)operator_new(0x58);
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x0;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (pointer)0x0;
    (local_38->super_Named).name.super_IString.str._M_len = 0;
    (local_38->super_Named).name.super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&(local_38->super_Named).hasExplicitName = 0;
    (local_38->memory).super_IString.str._M_len = 0;
    (local_38->memory).super_IString.str._M_str = (char *)0x0;
    *(undefined8 *)&local_38->isPassive = 0;
    local_38->offset = (Expression *)0x0;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x10000;
    *(undefined1 *)
     &(local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    local_38[1].super_Named.name.super_IString.str._M_len = 2;
    (local_38->super_Named).name.super_IString.str = sVar11;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = (pointer)0x10000;
    *(undefined1 *)
     &(local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    local_38[1].super_Named.name.super_IString.str._M_len = 2;
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,10);
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)(ulong)(uVar5 + 1);
    uVar5 = Random::upTo(pRVar1,2);
    pcVar9 = (pointer)0xffffffffffffffff;
    if (uVar5 == 0) {
      pcVar9 = (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar5 = Random::upTo(pRVar1,4);
      pcVar9 = pcVar9 + uVar5;
    }
    (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = pcVar9;
    if (((byte)this->wasm[0x179] & 8) != 0) {
      uVar5 = Random::upTo(pRVar1,2);
      if (uVar5 == 0) {
        local_38[1].super_Named.name.super_IString.str._M_len = 3;
      }
    }
    wasm::Module::addMemory((unique_ptr *)this->wasm);
    if (local_38 != (DataSegment *)0x0) {
      operator_delete(local_38,0x58);
    }
  }
  pMVar2 = this->wasm;
  local_50 = *(long **)(pMVar2 + 0x78);
  local_48 = this;
  if (((byte)pMVar2[0x178] & 0x10) == 0) {
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,(uint)(*(long *)(pMVar2 + 0x90) == *(long *)(pMVar2 + 0x98)) * 8 + 2
                        );
    if (uVar5 != 0) {
      auVar12 = wasm::IString::interned(0,"",0);
      memory_00.super_IString.str._M_len = auVar12._8_8_;
      pcVar6 = (char *)wasm::IString::interned(0,"",0);
      name.super_IString.str._M_str = auVar12._0_8_;
      name.super_IString.str._M_len = (size_t)&local_38;
      memory_00.super_IString.str._M_str = pcVar6;
      Builder::makeDataSegment
                (name,memory_00,isPassive,(Expression *)0x0,(char *)0x0,(Address)0x194830);
      pcVar6 = (char *)((size_t *)*local_50)[1];
      (local_38->memory).super_IString.str._M_len = *(size_t *)*local_50;
      (local_38->memory).super_IString.str._M_str = pcVar6;
      Literal::makeFromInt32(&local_88,0,(Type)*(uintptr_t *)(*local_50 + 0x50));
      pTVar3 = local_48;
      pCVar7 = Builder::makeConst(&local_48->builder,&local_88);
      local_38->offset = (Expression *)pCVar7;
      wasm::Literal::~Literal(&local_88);
      pDVar4 = local_38;
      pMVar2 = pTVar3->wasm;
      NVar13 = Name::fromInt(0);
      sVar11 = (string_view)Names::getValidDataSegmentName(pMVar2,NVar13);
      (pDVar4->super_Named).name.super_IString.str = sVar11;
      (pDVar4->super_Named).hasExplicitName = false;
      uVar5 = Random::upTo(pRVar1,(int)(pTVar3->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr * 2
                          );
      if (uVar5 != 0) {
        uVar10 = (ulong)uVar5;
        do {
          uVar5 = Random::upTo(pRVar1,0x200);
          local_39 = (char)uVar5;
          if (0xff < uVar5) {
            local_39 = '\0';
          }
          std::vector<char,_std::allocator<char>_>::emplace_back<char>(&local_38->data,&local_39);
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      wasm::Module::addDataSegment((unique_ptr *)pTVar3->wasm);
      if (local_38 != (DataSegment *)0x0) {
        std::default_delete<wasm::DataSegment>::operator()
                  ((default_delete<wasm::DataSegment> *)&local_38,local_38);
      }
    }
  }
  else {
    pRVar1 = &this->random;
    uVar5 = Random::upTo(pRVar1,8);
    local_68 = 1;
    if (*(long *)(this->wasm + 0x90) != *(long *)(this->wasm + 0x98)) {
      local_68 = (ulong)uVar5;
    }
    if (uVar5 != 0) {
      local_68 = (ulong)uVar5;
    }
    if (local_68 != 0) {
      local_60 = &local_48->builder;
      local_58 = 0;
      i = 0;
      do {
        auVar12 = wasm::IString::interned(0,"",0);
        memory_01.super_IString.str._M_len = auVar12._8_8_;
        pcVar6 = (char *)wasm::IString::interned(0,"",0);
        NVar13.super_IString.str._M_str = auVar12._0_8_;
        NVar13.super_IString.str._M_len = (size_t)&local_38;
        memory_01.super_IString.str._M_str = pcVar6;
        Builder::makeDataSegment
                  (NVar13,memory_01,isPassive_00,(Expression *)0x0,(char *)0x0,(Address)0x194830);
        pDVar4 = local_38;
        pMVar2 = local_48->wasm;
        local_70 = i;
        NVar13 = Name::fromInt(i);
        sVar11 = (string_view)Names::getValidDataSegmentName(pMVar2,NVar13);
        (pDVar4->super_Named).name.super_IString.str = sVar11;
        (pDVar4->super_Named).hasExplicitName = false;
        uVar5 = Random::upTo(pRVar1,2);
        local_38->isPassive = uVar5 != 0;
        uVar5 = Random::upTo(pRVar1,(int)(local_48->fuzzParams->super_FuzzParams).USABLE_MEMORY.addr
                                    * 2);
        uVar10 = (ulong)uVar5;
        std::vector<char,_std::allocator<char>_>::resize(&local_38->data,uVar10);
        if (uVar5 != 0) {
          uVar8 = 0;
          do {
            uVar5 = Random::upTo(pRVar1,0x200);
            (local_38->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] = (char)uVar5;
            uVar8 = uVar8 + 1;
          } while (uVar10 != uVar8);
        }
        if (local_38->isPassive == false) {
          Literal::makeFromInt32(&local_a0,(int32_t)local_58,(Type)*(uintptr_t *)(*local_50 + 0x50))
          ;
          pCVar7 = Builder::makeConst(local_60,&local_a0);
          local_38->offset = (Expression *)pCVar7;
          wasm::Literal::~Literal(&local_a0);
          local_58 = local_58 + uVar10;
          pcVar6 = (char *)((size_t *)*local_50)[1];
          (local_38->memory).super_IString.str._M_len = *(size_t *)*local_50;
          (local_38->memory).super_IString.str._M_str = pcVar6;
        }
        wasm::Module::addDataSegment((unique_ptr *)local_48->wasm);
        if (local_38 != (DataSegment *)0x0) {
          std::default_delete<wasm::DataSegment>::operator()
                    ((default_delete<wasm::DataSegment> *)&local_38,local_38);
        }
        i = local_70 + 1;
      } while (i != local_68);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupMemory() {
  // Add a memory, if one does not already exist.
  if (wasm.memories.empty()) {
    auto memory = Builder::makeMemory("0");
    // Add at least one page of memory.
    memory->initial = 1 + upTo(10);
    // Make the max potentially higher, or unlimited.
    if (oneIn(2)) {
      memory->max = memory->initial + upTo(4);
    } else {
      memory->max = Memory::kUnlimitedSize;
    }
    // Fuzz wasm64 when possible, sometimes.
    if (wasm.features.hasMemory64() && oneIn(2)) {
      memory->addressType = Type::i64;
    }
    wasm.addMemory(std::move(memory));
  }

  auto& memory = wasm.memories[0];
  if (wasm.features.hasBulkMemory()) {
    size_t numSegments = upTo(8);
    // need at least one segment for memory.inits
    if (wasm.dataSegments.empty() && !numSegments) {
      numSegments = 1;
    }
    size_t memCovered = 0;
    for (size_t i = 0; i < numSegments; i++) {
      auto segment = builder.makeDataSegment();
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(i)),
                       false);
      segment->isPassive = bool(upTo(2));
      size_t segSize = upTo(fuzzParams->USABLE_MEMORY * 2);
      segment->data.resize(segSize);
      for (size_t j = 0; j < segSize; j++) {
        segment->data[j] = upTo(512);
      }
      if (!segment->isPassive) {
        segment->offset = builder.makeConst(
          Literal::makeFromInt32(memCovered, memory->addressType));
        memCovered += segSize;
        segment->memory = memory->name;
      }
      wasm.addDataSegment(std::move(segment));
    }
  } else {
    // init some data, especially if none exists before
    if (!oneIn(wasm.dataSegments.empty() ? 10 : 2)) {
      auto segment = builder.makeDataSegment();
      segment->memory = memory->name;
      segment->offset =
        builder.makeConst(Literal::makeFromInt32(0, memory->addressType));
      segment->setName(Names::getValidDataSegmentName(wasm, Name::fromInt(0)),
                       false);
      auto num = upTo(fuzzParams->USABLE_MEMORY * 2);
      for (size_t i = 0; i < num; i++) {
        auto value = upTo(512);
        segment->data.push_back(value >= 256 ? 0 : (value & 0xff));
      }
      wasm.addDataSegment(std::move(segment));
    }
  }
}